

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
CTtMappingMeshInfoUserData::Read(CTtMappingMeshInfoUserData *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  ON_MappingMeshInfo *this_00;
  bool bVar2;
  int i;
  int iVar3;
  int nCount;
  int value;
  int nVersion;
  ON__INT32 local_2c [2];
  ON__INT32 local_24;
  
  local_24 = 1;
  bVar1 = ON_BinaryArchive::ReadInt(binary_archive,&local_24);
  bVar2 = false;
  if ((bVar1) && (local_24 == 1)) {
    bVar1 = ON_GeometryFingerprint::Read(&(this->m_info).m_geometryFingerprint,binary_archive);
    if (bVar1) {
      local_2c[0] = 0;
      bVar1 = ON_BinaryArchive::ReadInt(binary_archive,local_2c);
      iVar3 = 0;
      bVar2 = false;
      if (bVar1) {
        this_00 = &this->m_info;
        ON_SimpleArray<int>::SetCapacity(&this_00->m_faceSourceIds,(long)local_2c[0]);
        for (; iVar3 < local_2c[0]; iVar3 = iVar3 + 1) {
          local_2c[1] = 0xffffffff;
          bVar1 = ON_BinaryArchive::ReadInt(binary_archive,local_2c + 1);
          if (!bVar1) goto LAB_004fcdd1;
          ON_SimpleArray<int>::Append(&this_00->m_faceSourceIds,local_2c + 1);
        }
        ON_MappingMeshInfo::GenerateDerivedData(this_00);
        bVar2 = true;
      }
    }
    else {
LAB_004fcdd1:
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

virtual bool Read(ON_BinaryArchive& binary_archive)
  {
    if (!m_bArchive)
      return false;

    int nVersion = 1;

    if (!binary_archive.ReadInt(&nVersion))
      return false;

    if (1 != nVersion)
      return false;

    if (!m_info.m_geometryFingerprint.Read(binary_archive))
      return false;

    int nCount = 0;

    if (!binary_archive.ReadInt(&nCount))
      return false;

    m_info.m_faceSourceIds.SetCapacity(nCount);
    for (int i = 0; i < nCount; i++)
    {
      int value = -1;
      if (!binary_archive.ReadInt(&value))
        return false;
      m_info.m_faceSourceIds.Append(value);
    }

    m_info.GenerateDerivedData();

    return true;
  }